

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stresstest.c
# Opt level: O2

int verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  ulong uVar1;
  
  uVar1 = 1;
  do {
    if (((ulong)sig & 0xffffffff) <= uVar1) {
LAB_0010b774:
      return (int)(((ulong)sig & 0xffffffff) <= uVar1);
    }
    if (*(long *)(ctx + uVar1 * 8) < *(long *)(ctx + uVar1 * 8 + -8)) {
      printf("Verify failed! at %d",uVar1 & 0xffffffff);
      goto LAB_0010b774;
    }
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

int verify(int64_t *dst, const unsigned size) {
  for (unsigned i = 1; i < size; i++) {
    if (dst[i - 1] > dst[i]) {
      printf("Verify failed! at %d", i);
      return 0;
    }
  }
  return 1;
}